

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams.h
# Opt level: O2

void __thiscall
VectorWriter::VectorWriter<long&>
          (VectorWriter *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *vchDataIn,
          size_t nPosIn,long *args)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  VectorWriter(this,vchDataIn,nPosIn);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    SerializeMany<VectorWriter,long>(this,args);
    return;
  }
  __stack_chk_fail();
}

Assistant:

VectorWriter(std::vector<unsigned char>& vchDataIn, size_t nPosIn, Args&&... args) : VectorWriter{vchDataIn, nPosIn}
    {
        ::SerializeMany(*this, std::forward<Args>(args)...);
    }